

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PretransformVertices.cpp
# Opt level: O0

void __thiscall
Assimp::PretransformVertices::BuildWCSMeshes
          (PretransformVertices *this,vector<aiMesh_*,_std::allocator<aiMesh_*>_> *out,aiMesh **in,
          uint numIn,aiNode *node)

{
  uint uVar1;
  bool bVar2;
  ulong uVar3;
  size_type sVar4;
  reference ppaVar5;
  Logger *this_00;
  uint local_60;
  uint i_1;
  uint tmp;
  aiMesh *ntz;
  aiMesh *ctz;
  aiMesh *paStack_40;
  uint n;
  aiMesh *mesh;
  aiNode *paStack_30;
  uint i;
  aiNode *node_local;
  aiMesh **ppaStack_20;
  uint numIn_local;
  aiMesh **in_local;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> *out_local;
  PretransformVertices *this_local;
  
  paStack_30 = node;
  node_local._4_4_ = numIn;
  ppaStack_20 = in;
  in_local = (aiMesh **)out;
  out_local = (vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)this;
  for (mesh._4_4_ = 0; mesh._4_4_ < paStack_30->mNumMeshes; mesh._4_4_ = mesh._4_4_ + 1) {
    paStack_40 = ppaStack_20[paStack_30->mMeshes[mesh._4_4_]];
    if ((paStack_40->mBones == (aiBone **)0x0) ||
       (bVar2 = aiMatrix4x4t<float>::operator==
                          ((aiMatrix4x4t<float> *)paStack_40->mBones,&paStack_30->mTransformation),
       bVar2)) {
      paStack_40->mBones = (aiBone **)&paStack_30->mTransformation;
      paStack_40->mNumBones = 0xffffffff;
    }
    else {
      for (ctz._4_4_ = 0; uVar3 = (ulong)ctz._4_4_,
          sVar4 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size
                            ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)in_local), uVar3 < sVar4
          ; ctz._4_4_ = ctz._4_4_ + 1) {
        ppaVar5 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::operator[]
                            ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)in_local,
                             (ulong)ctz._4_4_);
        ntz = *ppaVar5;
        if ((ntz->mNumBones == paStack_30->mMeshes[mesh._4_4_]) &&
           (bVar2 = aiMatrix4x4t<float>::operator==
                              ((aiMatrix4x4t<float> *)ntz->mBones,&paStack_30->mTransformation),
           bVar2)) {
          paStack_30->mMeshes[mesh._4_4_] = node_local._4_4_ + ctz._4_4_;
        }
      }
      if (paStack_30->mMeshes[mesh._4_4_] < node_local._4_4_) {
        this_00 = DefaultLogger::get();
        Logger::info(this_00,"PretransformVertices: Copying mesh due to mismatching transforms");
        uVar1 = paStack_40->mNumBones;
        paStack_40->mNumBones = 0;
        SceneCombiner::Copy((aiMesh **)&i_1,paStack_40);
        paStack_40->mNumBones = uVar1;
        _i_1->mNumBones = paStack_30->mMeshes[mesh._4_4_];
        _i_1->mBones = (aiBone **)&paStack_30->mTransformation;
        std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::push_back
                  ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)in_local,(value_type *)&i_1);
        uVar1 = node_local._4_4_;
        sVar4 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size
                          ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)in_local);
        paStack_30->mMeshes[mesh._4_4_] = (uVar1 + (int)sVar4) - 1;
      }
    }
  }
  for (local_60 = 0; local_60 < paStack_30->mNumChildren; local_60 = local_60 + 1) {
    BuildWCSMeshes(this,(vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)in_local,ppaStack_20,
                   node_local._4_4_,paStack_30->mChildren[local_60]);
  }
  return;
}

Assistant:

void PretransformVertices::BuildWCSMeshes(std::vector<aiMesh *> &out, aiMesh **in,
		unsigned int numIn, aiNode *node) const {
	// NOTE:
	//  aiMesh::mNumBones store original source mesh, or UINT_MAX if not a copy
	//  aiMesh::mBones store reference to abs. transform we multiplied with

	// process meshes
	for (unsigned int i = 0; i < node->mNumMeshes; ++i) {
		aiMesh *mesh = in[node->mMeshes[i]];

		// check whether we can operate on this mesh
		if (!mesh->mBones || *reinterpret_cast<aiMatrix4x4 *>(mesh->mBones) == node->mTransformation) {
			// yes, we can.
			mesh->mBones = reinterpret_cast<aiBone **>(&node->mTransformation);
			mesh->mNumBones = UINT_MAX;
		} else {

			// try to find us in the list of newly created meshes
			for (unsigned int n = 0; n < out.size(); ++n) {
				aiMesh *ctz = out[n];
				if (ctz->mNumBones == node->mMeshes[i] && *reinterpret_cast<aiMatrix4x4 *>(ctz->mBones) == node->mTransformation) {

					// ok, use this one. Update node mesh index
					node->mMeshes[i] = numIn + n;
				}
			}
			if (node->mMeshes[i] < numIn) {
				// Worst case. Need to operate on a full copy of the mesh
				ASSIMP_LOG_INFO("PretransformVertices: Copying mesh due to mismatching transforms");
				aiMesh *ntz;

				const unsigned int tmp = mesh->mNumBones; //
				mesh->mNumBones = 0;
				SceneCombiner::Copy(&ntz, mesh);
				mesh->mNumBones = tmp;

				ntz->mNumBones = node->mMeshes[i];
				ntz->mBones = reinterpret_cast<aiBone **>(&node->mTransformation);

				out.push_back(ntz);

				node->mMeshes[i] = static_cast<unsigned int>(numIn + out.size() - 1);
			}
		}
	}

	// call children
	for (unsigned int i = 0; i < node->mNumChildren; ++i)
		BuildWCSMeshes(out, in, numIn, node->mChildren[i]);
}